

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainLib.c
# Opt level: O3

void Abc_Stop(void)

{
  Abc_Frame_t *pAbc;
  
  pAbc = Abc_FrameGetGlobalFrame();
  Abc_FrameEnd(pAbc);
  Abc_FrameDeallocate(pAbc);
  return;
}

Assistant:

void Abc_Stop()
{
    Abc_Frame_t * pAbc;
    pAbc = Abc_FrameGetGlobalFrame();
    // perform uninitializations
    Abc_FrameEnd( pAbc );
    // stop the framework
    Abc_FrameDeallocate( pAbc );
}